

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

bool __thiscall
QSQLiteDriverPrivate::isIdentifierEscaped(QSQLiteDriverPrivate *this,QStringView identifier)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  bool local_33;
  bool local_32;
  bool local_31;
  QChar local_24;
  QChar local_22;
  QStringView *in_stack_ffffffffffffffe0;
  QChar c;
  
  c.ucs = (char16_t)((ulong)in_RSI >> 0x30);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar3 = QStringView::size((QStringView *)&stack0xffffffffffffffe8);
  local_31 = false;
  if (qVar3 < 3) goto LAB_00113963;
  QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffffe6,L'\"');
  bVar2 = QStringView::startsWith(in_stack_ffffffffffffffe0,c);
  if (bVar2) {
    QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffffe4,L'\"');
    bVar2 = QStringView::endsWith(in_stack_ffffffffffffffe0,c);
    local_32 = true;
    if (!bVar2) goto LAB_001138b5;
  }
  else {
LAB_001138b5:
    QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffffe2,L'`');
    bVar2 = QStringView::startsWith(in_stack_ffffffffffffffe0,c);
    if (bVar2) {
      QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffffe0,L'`');
      bVar2 = QStringView::endsWith(in_stack_ffffffffffffffe0,c);
      local_32 = true;
      if (bVar2) goto LAB_0011395b;
    }
    QChar::QChar<char16_t,_true>(&local_22,L'[');
    bVar2 = QStringView::startsWith(in_stack_ffffffffffffffe0,c);
    local_33 = false;
    if (bVar2) {
      QChar::QChar<char16_t,_true>(&local_24,L']');
      local_33 = QStringView::endsWith(in_stack_ffffffffffffffe0,c);
    }
    local_32 = local_33;
  }
LAB_0011395b:
  local_31 = local_32;
LAB_00113963:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_31;
}

Assistant:

bool QSQLiteDriverPrivate::isIdentifierEscaped(QStringView identifier) const
{
    return identifier.size() > 2
            && ((identifier.startsWith(u'"') && identifier.endsWith(u'"'))
                || (identifier.startsWith(u'`') && identifier.endsWith(u'`'))
                || (identifier.startsWith(u'[') && identifier.endsWith(u']')));
}